

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O2

void __thiscall
btHingeConstraint::getInfo2InternalUsingFrameOffset
          (btHingeConstraint *this,btConstraintInfo2 *info,btTransform *transA,btTransform *transB,
          btVector3 *angVelA,btVector3 *angVelB)

{
  undefined8 uVar1;
  bool bVar2;
  btScalar *pbVar3;
  btHingeConstraint *pbVar4;
  btScalar abVar5 [4];
  long lVar6;
  btScalar *pbVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  char cVar12;
  long lVar13;
  btScalar *pbVar14;
  btHingeConstraint *pbVar15;
  uint uVar16;
  float fVar17;
  btScalar bVar18;
  float fVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar20;
  btScalar bVar21;
  float fVar22;
  float fVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  btVector3 bVar32;
  btVector3 ax1;
  btVector3 ax1B;
  btVector3 ax1A;
  btTransform trA;
  btTransform trB;
  btVector3 local_1d8;
  btVector3 local_1c8;
  btHingeConstraint *local_1b0;
  btVector3 local_1a8;
  undefined1 local_198 [16];
  btScalar local_188 [4];
  undefined1 local_178 [16];
  btScalar local_168 [4];
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  float local_124;
  float local_120;
  float local_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  btVector3 *local_100;
  btVector3 *local_f8;
  btVector3 local_f0;
  btVector3 local_e0;
  btVector3 local_d0;
  btVector3 local_c0;
  btTransform local_b0;
  btTransform local_70;
  
  local_198._8_8_ = local_198._0_8_;
  local_198._0_8_ = (long)info->rowskip;
  local_100 = angVelA;
  local_f8 = angVelB;
  btTransform::operator*(&local_b0,transA,&this->m_rbAFrame);
  btTransform::operator*(&local_70,transB,&this->m_rbBFrame);
  local_11c = local_70.m_origin.m_floats[0] - local_b0.m_origin.m_floats[0];
  local_124 = local_70.m_origin.m_floats[1] - local_b0.m_origin.m_floats[1];
  local_120 = local_70.m_origin.m_floats[2] - local_b0.m_origin.m_floats[2];
  fVar17 = ((this->super_btTypedConstraint).m_rbA)->m_inverseMass;
  fVar19 = ((this->super_btTypedConstraint).m_rbB)->m_inverseMass;
  local_158._0_4_ = -(uint)(1.1920929e-07 <= fVar17 && 1.1920929e-07 <= fVar19);
  fVar17 = fVar17 + fVar19;
  uVar16 = -(uint)(0.0 < fVar17);
  local_118 = (float)(~uVar16 & 0x3f000000 | (uint)(fVar19 / fVar17) & uVar16);
  local_178 = ZEXT416((uint)local_118);
  local_148 = 1.0 - local_118;
  local_c0.m_floats[1] = local_b0.m_basis.m_el[1].m_floats[2];
  local_c0.m_floats[0] = local_b0.m_basis.m_el[0].m_floats[2];
  local_c0.m_floats[2] = local_b0.m_basis.m_el[2].m_floats[2];
  local_c0.m_floats[3] = 0.0;
  local_d0.m_floats[1] = local_70.m_basis.m_el[1].m_floats[2];
  local_d0.m_floats[0] = local_70.m_basis.m_el[0].m_floats[2];
  local_d0.m_floats[2] = local_70.m_basis.m_el[2].m_floats[2];
  local_d0.m_floats[3] = 0.0;
  local_138 = ZEXT416((uint)local_148);
  local_1c8.m_floats[1] =
       local_70.m_basis.m_el[1].m_floats[2] * local_148 +
       local_b0.m_basis.m_el[1].m_floats[2] * local_118;
  local_1c8.m_floats[0] =
       local_70.m_basis.m_el[0].m_floats[2] * local_148 +
       local_b0.m_basis.m_el[0].m_floats[2] * local_118;
  local_1c8.m_floats[2] =
       local_70.m_basis.m_el[2].m_floats[2] * local_148 +
       local_b0.m_basis.m_el[2].m_floats[2] * local_118;
  local_1c8.m_floats[3] = 0.0;
  local_1b0 = this;
  fStack_144 = local_148;
  fStack_140 = local_148;
  fStack_13c = local_148;
  fStack_114 = local_118;
  fStack_110 = local_118;
  fStack_10c = local_118;
  btVector3::normalize(&local_1c8);
  uVar1 = *(undefined8 *)(transA->m_origin).m_floats;
  fVar23 = local_1c8.m_floats[0];
  fVar31 = local_1c8.m_floats[1];
  fVar17 = local_b0.m_origin.m_floats[0] - (float)uVar1;
  fVar19 = local_b0.m_origin.m_floats[1] - (float)((ulong)uVar1 >> 0x20);
  fVar20 = local_b0.m_origin.m_floats[2] - (transA->m_origin).m_floats[2];
  fVar22 = local_70.m_origin.m_floats[2] - (transB->m_origin).m_floats[2];
  uVar1 = *(undefined8 *)(transB->m_origin).m_floats;
  fVar26 = local_70.m_origin.m_floats[0] - (float)uVar1;
  fVar27 = local_70.m_origin.m_floats[1] - (float)((ulong)uVar1 >> 0x20);
  fVar28 = fVar20 * local_1c8.m_floats[2] + fVar17 * fVar23 + fVar19 * fVar31;
  fVar30 = fVar22 * local_1c8.m_floats[2] + fVar26 * fVar23 + fVar27 * fVar31;
  fVar26 = fVar26 - fVar30 * fVar23;
  fVar27 = fVar27 - fVar30 * fVar31;
  fVar22 = fVar22 - local_1c8.m_floats[2] * fVar30;
  fVar17 = fVar17 - fVar28 * fVar23;
  fVar19 = fVar19 - fVar28 * fVar31;
  fVar29 = fVar28 * fVar23 - fVar30 * fVar23;
  fVar31 = fVar28 * fVar31 - fVar30 * fVar31;
  fVar20 = fVar20 - local_1c8.m_floats[2] * fVar28;
  fVar23 = local_1c8.m_floats[2] * fVar28 - local_1c8.m_floats[2] * fVar30;
  local_e0.m_floats[1] = fStack_114 * fVar31 + fVar19;
  local_e0.m_floats[0] = local_118 * fVar29 + fVar17;
  local_e0.m_floats[2] = (float)local_178._0_4_ * fVar23 + fVar20;
  local_e0.m_floats[3] = 0.0;
  local_f0.m_floats[0] = fVar26 - fVar29 * local_148;
  local_f0.m_floats[1] = fVar27 - fVar31 * fStack_144;
  local_f0.m_floats[2] = fVar22 - fVar23 * (float)local_138._0_4_;
  local_f0.m_floats[3] = 0.0;
  local_1d8.m_floats[1] = fVar19 * fStack_144 + fStack_114 * fVar27;
  local_1d8.m_floats[0] = fVar17 * local_148 + local_118 * fVar26;
  local_1d8.m_floats[2] = fVar20 * (float)local_138._0_4_ + (float)local_178._0_4_ * fVar22;
  local_1d8.m_floats[3] = 0.0;
  bVar18 = btVector3::length2(&local_1d8);
  uVar24 = 0;
  uVar25 = 0;
  if (bVar18 <= 1.1920929e-07) {
    uVar24 = 0;
    uVar25 = 0;
    local_1d8.m_floats[1] = local_b0.m_basis.m_el[1].m_floats[1];
    local_1d8.m_floats[0] = local_b0.m_basis.m_el[0].m_floats[1];
    local_1d8.m_floats[2] = local_b0.m_basis.m_el[2].m_floats[1];
    local_1d8.m_floats[3] = 0.0;
    pbVar15 = local_1b0;
    lVar6 = local_198._0_8_;
    uVar16 = local_158._0_4_;
  }
  else {
    if (bVar18 < 0.0) {
      fVar17 = sqrtf(bVar18);
    }
    else {
      fVar17 = SQRT(bVar18);
    }
    pbVar15 = local_1b0;
    lVar6 = local_198._0_8_;
    uVar16 = local_158._0_4_;
    local_188[0] = fVar17;
    btVector3::operator/=(&local_1d8,local_188);
  }
  iVar11 = (int)lVar6;
  local_1a8 = btVector3::cross(&local_1c8,&local_1d8);
  local_188 = (btScalar  [4])btVector3::cross(&local_e0,&local_1d8);
  bVar32 = btVector3::cross(&local_f0,&local_1d8);
  local_168[0] = bVar32.m_floats[0];
  local_168[1] = bVar32.m_floats[1];
  local_168[2] = bVar32.m_floats[2];
  local_168[3] = bVar32.m_floats[3];
  pbVar7 = info->m_J1angularAxis;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pbVar7[lVar8] = local_188[lVar8];
  }
  pbVar7 = info->m_J2angularAxis;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pbVar7[lVar8] = -local_168[lVar8];
  }
  local_188 = (btScalar  [4])btVector3::cross(&local_e0,&local_1a8);
  local_158._8_4_ = extraout_XMM0_Dc;
  local_158._0_8_ = local_188._0_8_;
  local_158._12_4_ = extraout_XMM0_Dd;
  local_198._8_4_ = uVar24;
  local_198._0_8_ = local_188._8_8_;
  local_198._12_4_ = uVar25;
  bVar32 = btVector3::cross(&local_f0,&local_1a8);
  abVar5 = local_188;
  local_168[0] = bVar32.m_floats[0];
  local_168[1] = bVar32.m_floats[1];
  local_168[2] = bVar32.m_floats[2];
  local_168[3] = bVar32.m_floats[3];
  if ((pbVar15->m_limit).m_solveLimit != false && (uVar16 & 1) == 0) {
    local_168[1] = bVar32.m_floats[1] * fStack_144;
    local_168[0] = bVar32.m_floats[0] * local_148;
    local_168[3] = bVar32.m_floats[3];
    local_168[2] = bVar32.m_floats[2] * (float)local_138._0_4_;
    local_188[1] = (float)local_158._4_4_ * fStack_114;
    local_188[0] = (float)local_158._0_4_ * local_118;
    local_188[3] = abVar5[3];
    local_188[2] = (float)local_198._0_4_ * (float)local_178._0_4_;
  }
  pbVar7 = info->m_J1angularAxis;
  uVar24 = 0x80000000;
  uVar25 = 0x80000000;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pbVar7[lVar6 + lVar8] = local_188[lVar8];
  }
  pbVar7 = info->m_J2angularAxis;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pbVar7[lVar6 + lVar8] = -local_168[lVar8];
  }
  local_188 = (btScalar  [4])btVector3::cross(&local_e0,&local_1c8);
  local_158._8_4_ = extraout_XMM0_Dc_00;
  local_158._0_8_ = local_188._0_8_;
  local_158._12_4_ = extraout_XMM0_Dd_00;
  local_198._8_4_ = uVar24;
  local_198._0_8_ = local_188._8_8_;
  local_198._12_4_ = uVar25;
  bVar32 = btVector3::cross(&local_f0,&local_1c8);
  abVar5 = local_188;
  local_168[0] = bVar32.m_floats[0];
  local_168[1] = bVar32.m_floats[1];
  local_168[2] = bVar32.m_floats[2];
  local_168[3] = bVar32.m_floats[3];
  if ((uVar16 & 1) == 0) {
    local_168[1] = fStack_144 * bVar32.m_floats[1];
    local_168[0] = local_148 * bVar32.m_floats[0];
    local_168[3] = bVar32.m_floats[3];
    local_168[2] = (float)local_138._0_4_ * bVar32.m_floats[2];
    local_188[1] = fStack_114 * (float)local_158._4_4_;
    local_188[0] = local_118 * (float)local_158._0_4_;
    local_188[3] = abVar5[3];
    local_188[2] = (float)local_198._0_4_ * (float)local_178._0_4_;
  }
  pbVar7 = info->m_J1angularAxis;
  lVar8 = (long)(iVar11 * 2);
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    pbVar7[lVar8 + lVar13] = local_188[lVar13];
  }
  pbVar3 = info->m_J2angularAxis;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    pbVar3[lVar8 + lVar13] = -local_168[lVar13];
  }
  pbVar14 = &pbVar15->m_normalERP;
  if ((pbVar15->m_flags & 8) == 0) {
    pbVar14 = &info->erp;
  }
  fVar17 = *pbVar14;
  if (pbVar15->m_angularOnly == false) {
    fVar19 = info->fps * fVar17;
    pbVar14 = info->m_J1linearAxis;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar14[lVar13] = local_1d8.m_floats[lVar13];
    }
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar14[lVar6 + lVar13] = local_1a8.m_floats[lVar13];
    }
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar14[lVar8 + lVar13] = local_1c8.m_floats[lVar13];
    }
    pbVar14 = info->m_J2linearAxis;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar14[lVar13] = -local_1d8.m_floats[lVar13];
    }
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar14[lVar6 + lVar13] = -local_1a8.m_floats[lVar13];
    }
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar14[lVar8 + lVar13] = -local_1c8.m_floats[lVar13];
    }
    pbVar14 = info->m_constraintError;
    *pbVar14 = (local_1d8.m_floats[2] * local_120 +
               local_1d8.m_floats[0] * local_11c + local_1d8.m_floats[1] * local_124) * fVar19;
    pbVar14[lVar6] =
         (local_1a8.m_floats[2] * local_120 +
         local_1a8.m_floats[0] * local_11c + local_1a8.m_floats[1] * local_124) * fVar19;
    pbVar14[lVar8] =
         (local_120 * local_1c8.m_floats[2] +
         local_11c * local_1c8.m_floats[0] + local_124 * local_1c8.m_floats[1]) * fVar19;
  }
  iVar9 = iVar11 * 4;
  pbVar7[lVar6 * 3] = local_1d8.m_floats[0];
  lVar8 = (long)(iVar11 * 3);
  pbVar7[lVar8 + 1] = local_1d8.m_floats[1];
  pbVar7[lVar8 + 2] = local_1d8.m_floats[2];
  pbVar7[iVar9] = local_1a8.m_floats[0];
  iVar10 = iVar11 * 4 + 1;
  pbVar7[iVar10] = local_1a8.m_floats[1];
  iVar11 = iVar11 * 4 + 2;
  pbVar7[iVar11] = local_1a8.m_floats[2];
  pbVar3[lVar6 * 3] = -local_1d8.m_floats[0];
  pbVar3[lVar8 + 1] = -local_1d8.m_floats[1];
  pbVar3[lVar8 + 2] = -local_1d8.m_floats[2];
  pbVar3[iVar9] = -local_1a8.m_floats[0];
  pbVar3[iVar10] = -local_1a8.m_floats[1];
  pbVar3[iVar11] = -local_1a8.m_floats[2];
  local_178._0_4_ = info->fps * fVar17;
  local_138._0_4_ = fVar17;
  bVar32 = btVector3::cross(&local_c0,&local_d0);
  pbVar7 = info->m_constraintError;
  pbVar7[lVar6 * 3] =
       (local_1d8.m_floats[2] * bVar32.m_floats[2] +
       local_1d8.m_floats[0] * bVar32.m_floats[0] + local_1d8.m_floats[1] * bVar32.m_floats[1]) *
       (float)local_178._0_4_;
  pbVar7[iVar9] =
       (bVar32.m_floats[2] * local_1a8.m_floats[2] +
       local_1a8.m_floats[0] * bVar32.m_floats[0] + bVar32.m_floats[1] * local_1a8.m_floats[1]) *
       (float)local_178._0_4_;
  bVar2 = (pbVar15->m_limit).m_solveLimit;
  if (bVar2 == false) {
    if (pbVar15->m_enableAngularMotor != true) {
      return;
    }
    local_118 = 0.0;
    local_148 = 0.0;
    cVar12 = '\x01';
    pbVar15 = local_1b0;
  }
  else {
    local_118 = (pbVar15->m_limit).m_correction * pbVar15->m_referenceSign;
    local_148 = (float)CONCAT71((int7)((ulong)pbVar7 >> 8),0.0 < local_118);
    cVar12 = pbVar15->m_enableAngularMotor;
  }
  iVar11 = info->rowskip;
  lVar6 = (long)iVar11;
  pbVar7 = info->m_J1angularAxis;
  pbVar7[lVar6 * 5] = local_1c8.m_floats[0];
  lVar8 = (long)(iVar11 * 5);
  pbVar7[lVar8 + 1] = local_1c8.m_floats[1];
  pbVar7[lVar8 + 2] = local_1c8.m_floats[2];
  pbVar7 = info->m_J2angularAxis;
  pbVar7[lVar6 * 5] = -local_1c8.m_floats[0];
  pbVar7[lVar8 + 1] = -local_1c8.m_floats[1];
  pbVar7[lVar8 + 2] = -local_1c8.m_floats[2];
  local_178._0_4_ = btAngularLimit::getLow(&pbVar15->m_limit);
  bVar18 = btAngularLimit::getHigh(&pbVar15->m_limit);
  pbVar4 = local_1b0;
  pbVar7 = info->m_constraintError;
  pbVar7[lVar6 * 5] = 0.0;
  if ((pbVar15->m_flags & 2U) != 0) {
    local_138._0_4_ = local_1b0->m_stopERP;
  }
  if ((cVar12 != '\0') && (((float)local_178._0_4_ == bVar18 & bVar2) == 0)) {
    if ((pbVar15->m_flags & 4U) != 0) {
      info->cfm[lVar6 * 5] = local_1b0->m_normalCFM;
    }
    local_198._0_4_ = bVar18;
    bVar18 = btTypedConstraint::getMotorFactor
                       (&local_1b0->super_btTypedConstraint,local_1b0->m_hingeAngle,
                        (btScalar)local_178._0_4_,bVar18,local_1b0->m_motorTargetVelocity,
                        info->fps * (float)local_138._0_4_);
    pbVar7 = info->m_constraintError;
    pbVar7[lVar6 * 5] =
         bVar18 * pbVar4->m_motorTargetVelocity * pbVar4->m_referenceSign + pbVar7[lVar6 * 5];
    info->m_lowerLimit[lVar6 * 5] = -pbVar4->m_maxMotorImpulse;
    info->m_upperLimit[lVar6 * 5] = pbVar4->m_maxMotorImpulse;
    bVar18 = (btScalar)local_198._0_4_;
  }
  if (bVar2 == false) {
    return;
  }
  pbVar7[lVar6 * 5] = (float)local_138._0_4_ * info->fps * local_118 + pbVar7[lVar6 * 5];
  if ((local_1b0->m_flags & 1) != 0) {
    info->cfm[lVar6 * 5] = local_1b0->m_stopCFM;
  }
  if (((float)local_178._0_4_ != bVar18) || (NAN((float)local_178._0_4_) || NAN(bVar18))) {
    bVar18 = 0.0;
    bVar21 = 0.0;
    if (local_148._0_1_ == '\0') {
      bVar21 = -3.4028235e+38;
    }
    else {
      bVar18 = 3.4028235e+38;
    }
  }
  else {
    bVar18 = 3.4028235e+38;
    bVar21 = -3.4028235e+38;
  }
  info->m_lowerLimit[lVar6 * 5] = bVar21;
  info->m_upperLimit[lVar6 * 5] = bVar18;
  fVar17 = (local_1b0->m_limit).m_relaxationFactor;
  if (fVar17 <= 0.0) {
    fVar19 = pbVar7[lVar6 * 5];
  }
  else {
    fVar20 = (local_100->m_floats[2] * local_1c8.m_floats[2] +
             local_100->m_floats[0] * local_1c8.m_floats[0] +
             local_100->m_floats[1] * local_1c8.m_floats[1]) -
             (local_1c8.m_floats[2] * local_f8->m_floats[2] +
             local_1c8.m_floats[0] * local_f8->m_floats[0] +
             local_1c8.m_floats[1] * local_f8->m_floats[1]);
    fVar19 = pbVar7[lVar6 * 5];
    if (local_148._0_1_ == '\0') {
      if ((fVar20 <= 0.0) || (bVar18 = fVar20 * -fVar17, fVar19 <= bVar18)) goto LAB_001757b6;
    }
    else if ((0.0 <= fVar20) || (bVar18 = fVar20 * -fVar17, bVar18 <= fVar19)) goto LAB_001757b6;
    pbVar7[lVar6 * 5] = bVar18;
    fVar19 = bVar18;
  }
LAB_001757b6:
  pbVar7[lVar6 * 5] = fVar19 * (local_1b0->m_limit).m_biasFactor;
  return;
}

Assistant:

void btHingeConstraint::getInfo2InternalUsingFrameOffset(btConstraintInfo2* info, const btTransform& transA,const btTransform& transB,const btVector3& angVelA,const btVector3& angVelB)
{
	btAssert(!m_useSolveConstraintObsolete);
	int i, s = info->rowskip;
	// transforms in world space
	btTransform trA = transA*m_rbAFrame;
	btTransform trB = transB*m_rbBFrame;
	// pivot point
//	btVector3 pivotAInW = trA.getOrigin();
//	btVector3 pivotBInW = trB.getOrigin();
#if 1
	// difference between frames in WCS
	btVector3 ofs = trB.getOrigin() - trA.getOrigin();
	// now get weight factors depending on masses
	btScalar miA = getRigidBodyA().getInvMass();
	btScalar miB = getRigidBodyB().getInvMass();
	bool hasStaticBody = (miA < SIMD_EPSILON) || (miB < SIMD_EPSILON);
	btScalar miS = miA + miB;
	btScalar factA, factB;
	if(miS > btScalar(0.f))
	{
		factA = miB / miS;
	}
	else 
	{
		factA = btScalar(0.5f);
	}
	factB = btScalar(1.0f) - factA;
	// get the desired direction of hinge axis
	// as weighted sum of Z-orthos of frameA and frameB in WCS
	btVector3 ax1A = trA.getBasis().getColumn(2);
	btVector3 ax1B = trB.getBasis().getColumn(2);
	btVector3 ax1 = ax1A * factA + ax1B * factB;
	ax1.normalize();
	// fill first 3 rows 
	// we want: velA + wA x relA == velB + wB x relB
	btTransform bodyA_trans = transA;
	btTransform bodyB_trans = transB;
	int s0 = 0;
	int s1 = s;
	int s2 = s * 2;
	int nrow = 2; // last filled row
	btVector3 tmpA, tmpB, relA, relB, p, q;
	// get vector from bodyB to frameB in WCS
	relB = trB.getOrigin() - bodyB_trans.getOrigin();
	// get its projection to hinge axis
	btVector3 projB = ax1 * relB.dot(ax1);
	// get vector directed from bodyB to hinge axis (and orthogonal to it)
	btVector3 orthoB = relB - projB;
	// same for bodyA
	relA = trA.getOrigin() - bodyA_trans.getOrigin();
	btVector3 projA = ax1 * relA.dot(ax1);
	btVector3 orthoA = relA - projA;
	btVector3 totalDist = projA - projB;
	// get offset vectors relA and relB
	relA = orthoA + totalDist * factA;
	relB = orthoB - totalDist * factB;
	// now choose average ortho to hinge axis
	p = orthoB * factA + orthoA * factB;
	btScalar len2 = p.length2();
	if(len2 > SIMD_EPSILON)
	{
		p /= btSqrt(len2);
	}
	else
	{
		p = trA.getBasis().getColumn(1);
	}
	// make one more ortho
	q = ax1.cross(p);
	// fill three rows
	tmpA = relA.cross(p);
	tmpB = relB.cross(p);
    for (i=0; i<3; i++) info->m_J1angularAxis[s0+i] = tmpA[i];
    for (i=0; i<3; i++) info->m_J2angularAxis[s0+i] = -tmpB[i];
	tmpA = relA.cross(q);
	tmpB = relB.cross(q);
	if(hasStaticBody && getSolveLimit())
	{ // to make constraint between static and dynamic objects more rigid
		// remove wA (or wB) from equation if angular limit is hit
		tmpB *= factB;
		tmpA *= factA;
	}
	for (i=0; i<3; i++) info->m_J1angularAxis[s1+i] = tmpA[i];
    for (i=0; i<3; i++) info->m_J2angularAxis[s1+i] = -tmpB[i];
	tmpA = relA.cross(ax1);
	tmpB = relB.cross(ax1);
	if(hasStaticBody)
	{ // to make constraint between static and dynamic objects more rigid
		// remove wA (or wB) from equation
		tmpB *= factB;
		tmpA *= factA;
	}
	for (i=0; i<3; i++) info->m_J1angularAxis[s2+i] = tmpA[i];
    for (i=0; i<3; i++) info->m_J2angularAxis[s2+i] = -tmpB[i];

	btScalar normalErp = (m_flags & BT_HINGE_FLAGS_ERP_NORM)? m_normalERP : info->erp;
	btScalar k = info->fps * normalErp;

	if (!m_angularOnly)
	{
		for (i=0; i<3; i++) info->m_J1linearAxis[s0+i] = p[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s1+i] = q[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s2+i] = ax1[i];

		for (i=0; i<3; i++) info->m_J2linearAxis[s0+i] = -p[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s1+i] = -q[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s2+i] = -ax1[i];

	// compute three elements of right hand side
	
		btScalar rhs = k * p.dot(ofs);
		info->m_constraintError[s0] = rhs;
		rhs = k * q.dot(ofs);
		info->m_constraintError[s1] = rhs;
		rhs = k * ax1.dot(ofs);
		info->m_constraintError[s2] = rhs;
	}
	// the hinge axis should be the only unconstrained
	// rotational axis, the angular velocity of the two bodies perpendicular to
	// the hinge axis should be equal. thus the constraint equations are
	//    p*w1 - p*w2 = 0
	//    q*w1 - q*w2 = 0
	// where p and q are unit vectors normal to the hinge axis, and w1 and w2
	// are the angular velocity vectors of the two bodies.
	int s3 = 3 * s;
	int s4 = 4 * s;
	info->m_J1angularAxis[s3 + 0] = p[0];
	info->m_J1angularAxis[s3 + 1] = p[1];
	info->m_J1angularAxis[s3 + 2] = p[2];
	info->m_J1angularAxis[s4 + 0] = q[0];
	info->m_J1angularAxis[s4 + 1] = q[1];
	info->m_J1angularAxis[s4 + 2] = q[2];

	info->m_J2angularAxis[s3 + 0] = -p[0];
	info->m_J2angularAxis[s3 + 1] = -p[1];
	info->m_J2angularAxis[s3 + 2] = -p[2];
	info->m_J2angularAxis[s4 + 0] = -q[0];
	info->m_J2angularAxis[s4 + 1] = -q[1];
	info->m_J2angularAxis[s4 + 2] = -q[2];
	// compute the right hand side of the constraint equation. set relative
	// body velocities along p and q to bring the hinge back into alignment.
	// if ax1A,ax1B are the unit length hinge axes as computed from bodyA and
	// bodyB, we need to rotate both bodies along the axis u = (ax1 x ax2).
	// if "theta" is the angle between ax1 and ax2, we need an angular velocity
	// along u to cover angle erp*theta in one step :
	//   |angular_velocity| = angle/time = erp*theta / stepsize
	//                      = (erp*fps) * theta
	//    angular_velocity  = |angular_velocity| * (ax1 x ax2) / |ax1 x ax2|
	//                      = (erp*fps) * theta * (ax1 x ax2) / sin(theta)
	// ...as ax1 and ax2 are unit length. if theta is smallish,
	// theta ~= sin(theta), so
	//    angular_velocity  = (erp*fps) * (ax1 x ax2)
	// ax1 x ax2 is in the plane space of ax1, so we project the angular
	// velocity to p and q to find the right hand side.
	k = info->fps * normalErp;//??

	btVector3 u = ax1A.cross(ax1B);
	info->m_constraintError[s3] = k * u.dot(p);
	info->m_constraintError[s4] = k * u.dot(q);
#endif
	// check angular limits
	nrow = 4; // last filled row
	int srow;
	btScalar limit_err = btScalar(0.0);
	int limit = 0;
	if(getSolveLimit())
	{
#ifdef	_BT_USE_CENTER_LIMIT_
	limit_err = m_limit.getCorrection() * m_referenceSign;
#else
	limit_err = m_correction * m_referenceSign;
#endif
	limit = (limit_err > btScalar(0.0)) ? 1 : 2;

	}
	// if the hinge has joint limits or motor, add in the extra row
	int powered = 0;
	if(getEnableAngularMotor())
	{
		powered = 1;
	}
	if(limit || powered) 
	{
		nrow++;
		srow = nrow * info->rowskip;
		info->m_J1angularAxis[srow+0] = ax1[0];
		info->m_J1angularAxis[srow+1] = ax1[1];
		info->m_J1angularAxis[srow+2] = ax1[2];

		info->m_J2angularAxis[srow+0] = -ax1[0];
		info->m_J2angularAxis[srow+1] = -ax1[1];
		info->m_J2angularAxis[srow+2] = -ax1[2];

		btScalar lostop = getLowerLimit();
		btScalar histop = getUpperLimit();
		if(limit && (lostop == histop))
		{  // the joint motor is ineffective
			powered = 0;
		}
		info->m_constraintError[srow] = btScalar(0.0f);
		btScalar currERP = (m_flags & BT_HINGE_FLAGS_ERP_STOP) ? m_stopERP : normalErp;
		if(powered)
		{
			if(m_flags & BT_HINGE_FLAGS_CFM_NORM)
			{
				info->cfm[srow] = m_normalCFM;
			}
			btScalar mot_fact = getMotorFactor(m_hingeAngle, lostop, histop, m_motorTargetVelocity, info->fps * currERP);
			info->m_constraintError[srow] += mot_fact * m_motorTargetVelocity * m_referenceSign;
			info->m_lowerLimit[srow] = - m_maxMotorImpulse;
			info->m_upperLimit[srow] =   m_maxMotorImpulse;
		}
		if(limit)
		{
			k = info->fps * currERP;
			info->m_constraintError[srow] += k * limit_err;
			if(m_flags & BT_HINGE_FLAGS_CFM_STOP)
			{
				info->cfm[srow] = m_stopCFM;
			}
			if(lostop == histop) 
			{
				// limited low and high simultaneously
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else if(limit == 1) 
			{ // low limit
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else 
			{ // high limit
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			}
			// bounce (we'll use slider parameter abs(1.0 - m_dampingLimAng) for that)
#ifdef	_BT_USE_CENTER_LIMIT_
			btScalar bounce = m_limit.getRelaxationFactor();
#else
			btScalar bounce = m_relaxationFactor;
#endif
			if(bounce > btScalar(0.0))
			{
				btScalar vel = angVelA.dot(ax1);
				vel -= angVelB.dot(ax1);
				// only apply bounce if the velocity is incoming, and if the
				// resulting c[] exceeds what we already have.
				if(limit == 1)
				{	// low limit
					if(vel < 0)
					{
						btScalar newc = -bounce * vel;
						if(newc > info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
				else
				{	// high limit - all those computations are reversed
					if(vel > 0)
					{
						btScalar newc = -bounce * vel;
						if(newc < info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
			}
#ifdef	_BT_USE_CENTER_LIMIT_
			info->m_constraintError[srow] *= m_limit.getBiasFactor();
#else
			info->m_constraintError[srow] *= m_biasFactor;
#endif
		} // if(limit)
	} // if angular limit or powered
}